

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyInertia::ChLoadBodyInertia
          (ChLoadBodyInertia *this,shared_ptr<chrono::ChBody> *body,ChVector<double> *m_offset,
          double m_mass,ChVector<double> *m_IXX,ChVector<double> *m_IXY)

{
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_38,&body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustom::ChLoadCustom(&this->super_ChLoadCustom,(shared_ptr<chrono::ChLoadable> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_0116ccf0;
  (this->c_m).m_data[0] = m_offset->m_data[0];
  (this->c_m).m_data[1] = m_offset->m_data[1];
  (this->c_m).m_data[2] = m_offset->m_data[2];
  this->mass = m_mass;
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       m_IXX->m_data[0];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       m_IXX->m_data[1];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       m_IXX->m_data[2];
  SetInertiaXY(this,m_IXY);
  return;
}

Assistant:

ChLoadBodyInertia::ChLoadBodyInertia(std::shared_ptr<ChBody> body,  ///< object to apply additional inertia to
    const ChVector<>& m_offset,      ///< offset of the center of mass, in body coordinate system
    const double m_mass,             ///< added mass [kg]
    const ChVector<>& m_IXX,         ///< added diag. inertia values Ixx, Iyy, Izz (in body coordinate system, centered in body)
    const ChVector<>& m_IXY) 
    : ChLoadCustom(body), c_m(m_offset), mass(m_mass)
{
    this->SetInertiaXX(m_IXX);
    this->SetInertiaXY(m_IXY);
}